

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

ImageFormat __thiscall
deqp::gls::fboc::details::TestBase::getDefaultFormat(TestBase *this,GLenum attPoint,GLenum bufType)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Context *pCVar3;
  FormatFlags FVar4;
  FormatFlags FVar5;
  NotSupportedError *this_00;
  ImageFormat IVar6;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_90;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_60;
  
  if (bufType == 0) {
    IVar6.format = 0;
    IVar6.unsizedType = 0;
  }
  else {
    pCVar3 = this->m_ctx;
    FVar4 = FboUtil::formatFlag(attPoint);
    FVar5 = FboUtil::formatFlag(bufType);
    FboUtil::FormatDB::getFormats((Formats *)&local_90,&pCVar3->m_coreFormats,FVar4 | FVar5);
    p_Var1 = &local_90._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
      pCVar3 = this->m_ctx;
      FVar4 = FboUtil::formatFlag(attPoint);
      FVar5 = FboUtil::formatFlag(bufType);
      FboUtil::FormatDB::getFormats((Formats *)&local_60,&pCVar3->m_ctxFormats,FVar5 | FVar4);
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::clear(&local_90);
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var2 = &local_60._M_impl.super__Rb_tree_header;
        local_90._M_impl.super__Rb_tree_header._M_header._M_color =
             local_60._M_impl.super__Rb_tree_header._M_header._M_color;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header
        ;
        local_90._M_impl.super__Rb_tree_header._M_node_count =
             local_60._M_impl.super__Rb_tree_header._M_node_count;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&local_60);
    }
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Unsupported attachment kind for attachment point",
                 ::glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                 ,0x2bf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    IVar6.format = local_90._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    IVar6.unsizedType =
         *(GLenum *)&local_90._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4;
    std::
    _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
    ::~_Rb_tree(&local_90);
  }
  return IVar6;
}

Assistant:

ImageFormat TestBase::getDefaultFormat (GLenum attPoint, GLenum bufType) const
{
	if (bufType == GL_NONE)
	{
		return ImageFormat::none();
	}

	// Prefer a standard format, if there is one, but if not, use a format
	// provided by an extension.
	Formats formats = m_ctx.getCoreFormats().getFormats(formatFlag(attPoint) |
														 formatFlag(bufType));
	Formats::const_iterator it = formats.begin();
	if (it == formats.end())
	{
		formats = m_ctx.getCtxFormats().getFormats(formatFlag(attPoint) |
													 formatFlag(bufType));
		it = formats.begin();
	}
	if (it == formats.end())
		throw tcu::NotSupportedError("Unsupported attachment kind for attachment point",
									 "", __FILE__, __LINE__);
	return *it;
}